

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

int Abc_NtkDarDemiterDual(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  Aig_Man_t *p;
  char *pcVar2;
  Abc_Ntk_t *pAVar3;
  Aig_Man_t *pAVar4;
  Aig_Man_t *pPart1;
  Aig_Man_t *pPart0;
  char pFileName1 [1000];
  char pFileName0 [1000];
  
  if ((pNtk->vPos->nSize & 1) == 0) {
    pAVar3 = pNtk;
    p = Abc_NtkToDar(pNtk,0,1);
    if (p == (Aig_Man_t *)0x0) {
      Abc_Print((int)pAVar3,"Converting network into AIG has failed.\n");
      return 0;
    }
    pAVar4 = p;
    iVar1 = Saig_ManDemiterDual(p,&pPart0,&pPart1);
    if (iVar1 != 0) {
      if (pPart0->pName != (char *)0x0) {
        free(pPart0->pName);
        pPart0->pName = (char *)0x0;
      }
      pcVar2 = Abc_UtilStrsav("part0");
      pPart0->pName = pcVar2;
      if (pPart1->pName != (char *)0x0) {
        free(pPart1->pName);
        pPart1->pName = (char *)0x0;
      }
      pcVar2 = Abc_UtilStrsav("part1");
      pPart1->pName = pcVar2;
      pcVar2 = Extra_FileNameGeneric(pNtk->pSpec);
      builtin_strncpy(pFileName0,"part0.aig",10);
      builtin_strncpy(pFileName1,"part1.aig",10);
      free(pcVar2);
      Ioa_WriteAiger(pPart0,pFileName0,0,0);
      pAVar4 = pPart1;
      Ioa_WriteAiger(pPart1,pFileName1,0,0);
      Abc_Print((int)pAVar4,"Demitering produced two files \"%s\" and \"%s\".\n",pFileName0,
                pFileName1);
      if (fVerbose != 0) {
        Aig_ManPrintStats(p);
        Aig_ManPrintStats(pPart0);
        Aig_ManPrintStats(pPart1);
      }
      Aig_ManStop(pPart0);
      Aig_ManStop(pPart1);
      Aig_ManStop(p);
      return 1;
    }
    pcVar2 = "Demitering has failed.\n";
    pNtk = (Abc_Ntk_t *)pAVar4;
  }
  else {
    pcVar2 = "The number of POs should be even.\n";
  }
  Abc_Print((int)pNtk,pcVar2);
  return 0;
}

Assistant:

int Abc_NtkDarDemiterDual( Abc_Ntk_t * pNtk, int fVerbose )
{ 
    char * pFileNameGeneric, pFileName0[1000], pFileName1[1000];
    Aig_Man_t * pMan, * pPart0, * pPart1;//, * pMiter;
    if ( (Abc_NtkPoNum(pNtk) & 1) )
    {
        Abc_Print( 1, "The number of POs should be even.\n" );
        return 0;
    }
    // derive the AIG manager
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting network into AIG has failed.\n" );
        return 0;
    }
//    if ( !Saig_ManDemiterSimple( pMan, &pPart0, &pPart1 ) )
    if ( !Saig_ManDemiterDual( pMan, &pPart0, &pPart1 ) )
    {
        Abc_Print( 1, "Demitering has failed.\n" );
        return 0;
    }
    // create new AIG
    ABC_FREE( pPart0->pName );
    pPart0->pName = Abc_UtilStrsav( "part0" );
    // create new AIGs
    ABC_FREE( pPart1->pName );
    pPart1->pName = Abc_UtilStrsav( "part1" );
    // create file names
    pFileNameGeneric = Extra_FileNameGeneric( pNtk->pSpec );
//    sprintf( pFileName0,  "%s%s",  pFileNameGeneric, "_part0.aig" ); 
//    sprintf( pFileName1,  "%s%s",  pFileNameGeneric, "_part1.aig" ); 
    sprintf( pFileName0,  "%s",  "part0.aig" ); 
    sprintf( pFileName1,  "%s",  "part1.aig" ); 
    ABC_FREE( pFileNameGeneric );
    Ioa_WriteAiger( pPart0, pFileName0, 0, 0 );
    Ioa_WriteAiger( pPart1, pFileName1, 0, 0 );
    Abc_Print( 1, "Demitering produced two files \"%s\" and \"%s\".\n", pFileName0, pFileName1 );
    // dump files
    if ( fVerbose )
    {
//        Abc_Print( 1, "Init:  " );
        Aig_ManPrintStats( pMan );
//        Abc_Print( 1, "Part1: " );
        Aig_ManPrintStats( pPart0 );
//        Abc_Print( 1, "Part2: " );
        Aig_ManPrintStats( pPart1 );
    }
    // create two-level miter
//    pMiter = Saig_ManCreateMiterTwo( pPart0, pPart1, 2 );
//    Aig_ManDumpBlif( pMiter, "miter01.blif", NULL, NULL );
//    Aig_ManStop( pMiter );
//    Abc_Print( 1, "The new miter is written into file \"%s\".\n", "miter01.blif" );
    Aig_ManStop( pPart0 );
    Aig_ManStop( pPart1 );
    Aig_ManStop( pMan );
    return 1;
}